

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Boxed_Number chaiscript::Boxed_Number::assign_bitwise_and(Boxed_Number *t_lhs,Boxed_Number *t_rhs)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Boxed_Number BVar1;
  element_type *v;
  Boxed_Number *this;
  Boxed_Value *in_stack_ffffffffffffffc8;
  Boxed_Value *in_stack_ffffffffffffffd0;
  Opers in_stack_ffffffffffffffdc;
  
  this = (Boxed_Number *)&stack0xffffffffffffffd8;
  v = in_RDI;
  oper(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  Boxed_Number(this,(Boxed_Value *)v);
  Boxed_Value::~Boxed_Value((Boxed_Value *)0x3afbca);
  BVar1.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (Boxed_Number)
         BVar1.bv.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Number assign_bitwise_and(Boxed_Number t_lhs, const Boxed_Number &t_rhs)
      {
        return oper(Operators::assign_bitwise_and, t_lhs.bv, t_rhs.bv);
      }